

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O1

PSymbolConst * __thiscall ZCCCompiler::CompileConstant(ZCCCompiler *this,ZCC_ConstantDef *def)

{
  ZCC_TreeNode *pZVar1;
  undefined4 uVar2;
  ENamedName EVar3;
  PType *pPVar4;
  PClass *pPVar5;
  PClass *pPVar6;
  PErrorType *pPVar7;
  int iVar8;
  ZCC_Expression *node;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PSymbolConstString *this_00;
  char *msg;
  FName local_34;
  
  if (def->Symbol != (PSymbolConst *)0x0) {
    __assert_fail("def->Symbol == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0xbb,"PSymbolConst *ZCCCompiler::CompileConstant(ZCC_ConstantDef *)");
  }
  def->Symbol = (PSymbolConst *)0x1;
  node = Simplify(this,def->Value);
  def->Value = node;
  pPVar5 = PInt::RegistrationInfo.MyClass;
  if ((node->super_ZCC_TreeNode).NodeType == AST_ExprConstant) {
    pPVar4 = node->Type;
    if (pPVar4 == (PType *)TypeString) {
      this_00 = (PSymbolConstString *)
                M_Malloc_Dbg(0x38,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                             ,0x1f7);
      local_34.Index = (def->super_ZCC_NamedNode).NodeName;
      PSymbolConstString::PSymbolConstString
                (this_00,&local_34,(FString *)node[1].super_ZCC_TreeNode.SiblingNext);
      goto LAB_006a07e6;
    }
    if ((((PBasicType *)&pPVar4->super_DObject)->super_PType).super_DObject.Class == (PClass *)0x0)
    {
      iVar8 = (**(((PBasicType *)&pPVar4->super_DObject)->super_PType).super_DObject._vptr_DObject)
                        (pPVar4);
      (((PBasicType *)&pPVar4->super_DObject)->super_PType).super_DObject.Class =
           (PClass *)CONCAT44(extraout_var,iVar8);
    }
    pPVar6 = PFloat::RegistrationInfo.MyClass;
    if ((((PBasicType *)&pPVar4->super_DObject)->super_PType).super_DObject.Class == pPVar5) {
      this_00 = (PSymbolConstString *)
                M_Malloc_Dbg(0x38,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                             ,0x1f7);
      EVar3 = (def->super_ZCC_NamedNode).NodeName;
      pPVar4 = node->Type;
      uVar2 = *(undefined4 *)&node[1].super_ZCC_TreeNode.SiblingNext;
      DObject::DObject((DObject *)this_00);
      *(ENamedName *)&(this_00->super_PSymbolConst).super_PSymbol.super_DObject.field_0x24 = EVar3;
      (this_00->super_PSymbolConst).ValueType = pPVar4;
      (this_00->super_PSymbolConst).super_PSymbol.super_DObject._vptr_DObject =
           (_func_int **)&PTR_StaticType_008479b0;
      *(undefined4 *)&(this_00->Str).Chars = uVar2;
      goto LAB_006a07e6;
    }
    pPVar4 = node->Type;
    if ((pPVar4->super_DObject).Class == (PClass *)0x0) {
      iVar8 = (**(pPVar4->super_DObject)._vptr_DObject)(pPVar4);
      (pPVar4->super_DObject).Class = (PClass *)CONCAT44(extraout_var_00,iVar8);
    }
    if ((pPVar4->super_DObject).Class == pPVar6) {
      this_00 = (PSymbolConstString *)
                M_Malloc_Dbg(0x38,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                             ,0x1f7);
      EVar3 = (def->super_ZCC_NamedNode).NodeName;
      pPVar4 = node->Type;
      pZVar1 = node[1].super_ZCC_TreeNode.SiblingNext;
      DObject::DObject((DObject *)this_00);
      *(ENamedName *)&(this_00->super_PSymbolConst).super_PSymbol.super_DObject.field_0x24 = EVar3;
      (this_00->super_PSymbolConst).ValueType = pPVar4;
      (this_00->super_PSymbolConst).super_PSymbol.super_DObject._vptr_DObject =
           (_func_int **)&PTR_StaticType_008479b0;
      (this_00->Str).Chars = (char *)pZVar1;
      goto LAB_006a07e6;
    }
    node = def->Value;
    msg = "Bad type for constant definiton";
  }
  else {
    msg = "Constant definition requires a constant value";
  }
  this_00 = (PSymbolConstString *)0x0;
  Error(this,&node->super_ZCC_TreeNode,msg);
LAB_006a07e6:
  if (this_00 == (PSymbolConstString *)0x0) {
    this_00 = (PSymbolConstString *)
              M_Malloc_Dbg(0x38,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                           ,0x1f7);
    pPVar7 = TypeError;
    EVar3 = (def->super_ZCC_NamedNode).NodeName;
    DObject::DObject((DObject *)this_00);
    *(ENamedName *)&(this_00->super_PSymbolConst).super_PSymbol.super_DObject.field_0x24 = EVar3;
    (this_00->super_PSymbolConst).ValueType = &pPVar7->super_PType;
    (this_00->super_PSymbolConst).super_PSymbol.super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_008479b0;
    *(undefined4 *)&(this_00->Str).Chars = 0;
  }
  def->Symbol = &this_00->super_PSymbolConst;
  PSymbolTable::ReplaceSymbol(this->Symbols,(PSymbol *)this_00);
  return &this_00->super_PSymbolConst;
}

Assistant:

PSymbolConst *ZCCCompiler::CompileConstant(ZCC_ConstantDef *def)
{
	assert(def->Symbol == NULL);

	def->Symbol = DEFINING_CONST;	// avoid recursion
	ZCC_Expression *val = Simplify(def->Value);
	def->Value = val;
	PSymbolConst *sym = NULL;
	if (val->NodeType == AST_ExprConstant)
	{
		ZCC_ExprConstant *cval = static_cast<ZCC_ExprConstant *>(val);
		if (cval->Type == TypeString)
		{
			sym = new PSymbolConstString(def->NodeName, *(cval->StringVal));
		}
		else if (cval->Type->IsA(RUNTIME_CLASS(PInt)))
		{
			sym = new PSymbolConstNumeric(def->NodeName, cval->Type, cval->IntVal);
		}
		else if (cval->Type->IsA(RUNTIME_CLASS(PFloat)))
		{
			sym = new PSymbolConstNumeric(def->NodeName, cval->Type, cval->DoubleVal);
		}
		else
		{
			Error(def->Value, "Bad type for constant definiton");
		}
	}
	else
	{
		Error(def->Value, "Constant definition requires a constant value");
	}
	if (sym == NULL)
	{
		// Create a dummy constant so we don't make any undefined value warnings.
		sym = new PSymbolConstNumeric(def->NodeName, TypeError, 0);
	}
	def->Symbol = sym;
	Symbols->ReplaceSymbol(sym);
	return sym;
}